

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_coletree.c
# Opt level: O2

int sp_coletree(int_t *acolst,int_t *acolend,int_t *arow,int nr,int nc,int *parent)

{
  uint uVar1;
  int *addr;
  int *pp;
  int *addr_00;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ulong local_60;
  
  addr = mxCallocInt(nc);
  pp = mxCallocInt(nc);
  addr_00 = mxCallocInt(nr);
  uVar2 = 0;
  uVar3 = (ulong)(uint)nr;
  if (nr < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    addr_00[uVar2] = nc;
  }
  uVar3 = 0;
  uVar2 = 0;
  if (0 < nc) {
    uVar2 = (ulong)(uint)nc;
  }
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    for (lVar4 = (long)acolst[uVar3]; lVar4 < acolend[uVar3]; lVar4 = lVar4 + 1) {
      iVar5 = addr_00[arow[lVar4]];
      if ((int)uVar3 <= addr_00[arow[lVar4]]) {
        iVar5 = (int)uVar3;
      }
      addr_00[arow[lVar4]] = iVar5;
    }
  }
  for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    iVar5 = (int)uVar3;
    pp[uVar3] = iVar5;
    addr[uVar3] = iVar5;
    parent[uVar3] = nc;
    local_60 = uVar3 & 0xffffffff;
    for (lVar4 = (long)acolst[uVar3]; lVar4 < acolend[uVar3]; lVar4 = lVar4 + 1) {
      if ((long)addr_00[arow[lVar4]] < (long)uVar3) {
        uVar1 = find(addr_00[arow[lVar4]],pp);
        if (uVar3 != (uint)addr[(int)uVar1]) {
          parent[addr[(int)uVar1]] = iVar5;
          pp[(int)local_60] = uVar1;
          addr[(int)uVar1] = iVar5;
          local_60 = (ulong)uVar1;
        }
      }
    }
  }
  superlu_free(addr);
  superlu_free(addr_00);
  superlu_free(pp);
  return 0;
}

Assistant:

int sp_coletree(
                const int_t *acolst, const int_t *acolend, /* column start and end past 1 */
                const int_t *arow,                 /* row indices of A */
                int nr, int nc,            /* dimension of A */
                int *parent)               /* parent in elim tree */
{
	int	*root;			/* root of subtree of etree 	*/
	int     *firstcol;		/* first nonzero col in each row*/
	int	rset, cset;             
	int	row, col;
	int	rroot;
	int	p;
	int     *pp;

	root = mxCallocInt (nc);
	initialize_disjoint_sets (nc, &pp);

	/* Compute firstcol[row] = first nonzero column in row */

	firstcol = mxCallocInt (nr);
	for (row = 0; row < nr; firstcol[row++] = nc);
	for (col = 0; col < nc; col++) 
		for (p = acolst[col]; p < acolend[col]; p++) {
			row = arow[p];
			firstcol[row] = SUPERLU_MIN(firstcol[row], col);
		}

	/* Compute etree by Liu's algorithm for symmetric matrices,
           except use (firstcol[r],c) in place of an edge (r,c) of A.
	   Thus each row clique in A'*A is replaced by a star
	   centered at its first vertex, which has the same fill. */

	for (col = 0; col < nc; col++) {
		cset = make_set (col, pp);
		root[cset] = col;
		parent[col] = nc; /* Matlab */
		for (p = acolst[col]; p < acolend[col]; p++) {
			row = firstcol[arow[p]];
			if (row >= col) continue;
			rset = find (row, pp);
			rroot = root[rset];
			if (rroot != col) {
				parent[rroot] = col;
				cset = link (cset, rset, pp);
				root[cset] = col;
			}
		}
	}

	SUPERLU_FREE (root);
	SUPERLU_FREE (firstcol);
	finalize_disjoint_sets (pp);
	return 0;
}